

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O1

void __thiscall
ConditionalEstimator::setParameter(ConditionalEstimator *this,Property *p,double value)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double **ppdVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar2 = *p;
  if (iVar2 == 3) {
    this->nDist = (int)value;
  }
  else if (iVar2 == 2) {
    this->aDistRange[1] = value;
  }
  else {
    if (iVar2 != 1) {
      return;
    }
    this->aDistRange[0] = value;
  }
  iVar3 = this->nPre;
  iVar4 = this->nPost;
  iVar2 = iVar4 + iVar3;
  if (this->aDist != (double **)0x0) {
    if (-1 < iVar2) {
      uVar9 = 0;
      do {
        if (this->aDist[uVar9] != (double *)0x0) {
          operator_delete__(this->aDist[uVar9]);
        }
        uVar9 = uVar9 + 1;
      } while (iVar4 + iVar3 + 1 != uVar9);
    }
    if (this->aDist != (double **)0x0) {
      operator_delete__(this->aDist);
    }
  }
  dVar1 = this->aDistRange[1];
  this->dDistOffset = this->aDistRange[0];
  iVar5 = this->nDist;
  this->dDistScale = (dVar1 - this->aDistRange[0]) / (double)iVar5;
  uVar9 = (long)(iVar4 + iVar3 + 1) << 3;
  if (iVar2 < -1) {
    uVar9 = 0xffffffffffffffff;
  }
  ppdVar6 = (double **)operator_new__(uVar9);
  this->aDist = ppdVar6;
  if (-1 < iVar2) {
    uVar9 = (long)iVar5 << 3;
    if (iVar5 < 0) {
      uVar9 = 0xffffffffffffffff;
    }
    uVar8 = 0;
    do {
      pdVar7 = (double *)operator_new__(uVar9);
      this->aDist[uVar8] = pdVar7;
      uVar8 = uVar8 + 1;
    } while (iVar3 + iVar4 + 1 != uVar8);
  }
  return;
}

Assistant:

void ConditionalEstimator::setParameter( const Property& p, double value )
{
	// assign parameter
	if (p==EST_DIST_MIN)
		aDistRange[0] = value;
	else if (p==EST_DIST_MAX)
		aDistRange[1] = value;
	else if (p==EST_DIST_BINS)
		nDist = (int)value;
	else return;
	
	// re-generate distribution
	int size = nPre+nPost+1;
	if (aDist) {
		for( int i=0; i<size; i++ )
			if (aDist[i])
				delete[] aDist[i];
		delete[] aDist;
	}
	dDistOffset = double(aDistRange[0]);
	dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	aDist = new double *[size];
	for( int i=0; i<size; i++ )
		aDist[i] = new double[nDist];
}